

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::~TcpConnection(TcpConnection *this)

{
  LogLevel LVar1;
  sz_fd v;
  LogStream *pLVar2;
  self *psVar3;
  pointer this_00;
  char *str;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  local_10 = this;
  LVar1 = Logger::logLevel();
  if ((int)LVar1 < 2) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_ff0,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x3a,DEBUG,"~TcpConnection");
    pLVar2 = Logger::stream(&local_fe0);
    psVar3 = LogStream::operator<<(pLVar2,"TcpConnection::dtor[");
    psVar3 = LogStream::operator<<(psVar3,&this->m_name);
    psVar3 = LogStream::operator<<(psVar3,"] at ");
    pLVar2 = LogStream::operator<<(psVar3,this);
    psVar3 = LogStream::operator<<(pLVar2," fd=");
    this_00 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
              operator->(&this->m_channel);
    v = Channel::fd(this_00);
    pLVar2 = LogStream::operator<<(psVar3,v);
    psVar3 = LogStream::operator<<(pLVar2," state=");
    str = stateToString(this);
    LogStream::operator<<(psVar3,str);
    Logger::~Logger(&local_fe0);
  }
  if (this->m_state == kDisconnected) {
    Buffer::~Buffer(&this->m_outputBuffer);
    Buffer::~Buffer(&this->m_inputBuffer);
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
              (&this->m_closeCallback);
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>::
    ~function(&this->m_highWaterMarkCallback);
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
              (&this->m_writeCompleteCallback);
    std::
    function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
    ::~function(&this->m_messageCallback);
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
              (&this->m_connectionCallback);
    std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
              (&this->m_channel);
    std::unique_ptr<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>::~unique_ptr
              (&this->m_socket);
    std::__cxx11::string::~string((string *)&this->m_name);
    std::enable_shared_from_this<sznet::net::TcpConnection>::~enable_shared_from_this
              (&this->super_enable_shared_from_this<sznet::net::TcpConnection>);
    return;
  }
  __assert_fail("m_state == kDisconnected",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x3d,"sznet::net::TcpConnection::~TcpConnection()");
}

Assistant:

TcpConnection::~TcpConnection()
{
	LOG_DEBUG << "TcpConnection::dtor[" << m_name << "] at " << this
		<< " fd=" << m_channel->fd()
		<< " state=" << stateToString();
	assert(m_state == kDisconnected);
}